

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fApiCase.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::ApiCase::expectError(ApiCase *this,deUint32 expected0,deUint32 expected1)

{
  qpTestResult qVar1;
  MessageBuilder *pMVar2;
  Enum<int,_2UL> EVar3;
  Enum<int,_2UL> local_1e0;
  GetNameFunc local_1d0;
  int local_1c8;
  Enum<int,_2UL> local_1c0 [2];
  MessageBuilder local_1a0;
  GLenum local_1c;
  GLenum local_18;
  deUint32 err;
  deUint32 expected1_local;
  deUint32 expected0_local;
  ApiCase *this_local;
  
  local_18 = expected1;
  err = expected0;
  _expected1_local = this;
  local_1c = glu::CallLogWrapper::glGetError(&this->super_CallLogWrapper);
  if ((local_1c != err) && (local_1c != local_18)) {
    tcu::TestLog::operator<<(&local_1a0,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar2 = tcu::MessageBuilder::operator<<(&local_1a0,(char (*) [20])"// ERROR: expected ");
    EVar3 = glu::getErrorStr(err);
    local_1d0 = EVar3.m_getName;
    local_1c8 = EVar3.m_value;
    local_1c0[0].m_getName = local_1d0;
    local_1c0[0].m_value = local_1c8;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,local_1c0);
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,(char (*) [5])" or ");
    EVar3 = glu::getErrorStr(local_18);
    local_1e0.m_getName = EVar3.m_getName;
    local_1e0.m_value = EVar3.m_value;
    pMVar2 = tcu::MessageBuilder::operator<<(pMVar2,&local_1e0);
    tcu::MessageBuilder::operator<<(pMVar2,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a0);
    qVar1 = tcu::TestContext::getTestResult
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    if (qVar1 == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Got invalid error");
    }
  }
  return;
}

Assistant:

void ApiCase::expectError (deUint32 expected0, deUint32 expected1)
{
	deUint32 err = glGetError();
	if (err != expected0 && err != expected1)
	{
		m_log << TestLog::Message << "// ERROR: expected " << glu::getErrorStr(expected0) << " or " << glu::getErrorStr(expected1) << TestLog::EndMessage;
		if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid error");
	}
}